

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O2

bool P_Thing_Raise(AActor *thing,AActor *raiser)

{
  uint uVar1;
  double dVar2;
  bool bVar3;
  FState *newstate;
  AActor *pAVar4;
  bool bVar5;
  FSoundID local_4c;
  double local_48;
  double dStack_40;
  DVector2 local_38;
  
  newstate = AActor::GetRaiseState(thing);
  bVar5 = true;
  if (newstate != (FState *)0x0) {
    pAVar4 = AActor::GetDefault(thing);
    (thing->Vel).X = 0.0;
    (thing->Vel).Y = 0.0;
    local_48 = thing->radius;
    dStack_40 = thing->Height;
    uVar1 = (thing->flags).Value;
    (thing->flags).Value = uVar1 | 2;
    dVar2 = pAVar4->Height;
    thing->radius = pAVar4->radius;
    thing->Height = dVar2;
    local_38.X = (thing->__Pos).X;
    local_38.Y = (thing->__Pos).Y;
    bVar3 = P_CheckPosition(thing,&local_38,false);
    if (bVar3) {
      local_4c.ID = S_FindSound("vile/raise");
      S_Sound(thing,4,&local_4c,1.0,1.001);
      AActor::Revive(thing);
      if (raiser != (AActor *)0x0) {
        AActor::CopyFriendliness(thing,raiser,false,true);
      }
      AActor::SetState(thing,newstate,false);
    }
    else {
      (thing->flags).Value = uVar1;
      thing->radius = local_48;
      thing->Height = dStack_40;
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool P_Thing_Raise(AActor *thing, AActor *raiser)
{
	FState * RaiseState = thing->GetRaiseState();
	if (RaiseState == NULL)
	{
		return true;	// monster doesn't have a raise state
	}
	
	AActor *info = thing->GetDefault ();

	thing->Vel.X = thing->Vel.Y = 0;

	// [RH] Check against real height and radius
	double oldheight = thing->Height;
	double oldradius = thing->radius;
	ActorFlags oldflags = thing->flags;

	thing->flags |= MF_SOLID;
	thing->Height = info->Height;	// [RH] Use real height
	thing->radius = info->radius;	// [RH] Use real radius
	if (!P_CheckPosition (thing, thing->Pos()))
	{
		thing->flags = oldflags;
		thing->radius = oldradius;
		thing->Height = oldheight;
		return false;
	}


	S_Sound (thing, CHAN_BODY, "vile/raise", 1, ATTN_IDLE);

	thing->Revive();

	if (raiser != NULL)
	{
		// Let's copy the friendliness of the one who raised it.
		thing->CopyFriendliness(raiser, false);
	}

	thing->SetState (RaiseState);
	return true;
}